

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_dss_signv
              (LIBSSH2_SESSION *session,uchar **signature,size_t *signature_len,int veccount,
              iovec *datavec,void **abstract)

{
  DSA *dsactx_00;
  int iVar1;
  uchar *puVar2;
  int local_74;
  EVP_MD_CTX *pEStack_70;
  int i;
  EVP_MD_CTX *ctx;
  uchar hash [20];
  DSA *dsactx;
  void **abstract_local;
  iovec *datavec_local;
  int veccount_local;
  size_t *signature_len_local;
  uchar **signature_local;
  LIBSSH2_SESSION *session_local;
  
  dsactx_00 = (DSA *)*abstract;
  puVar2 = (uchar *)_libssh2_calloc(session,0x28);
  *signature = puVar2;
  if (*signature == (uchar *)0x0) {
    session_local._4_4_ = -1;
  }
  else {
    *signature_len = 0x28;
    _libssh2_sha1_init((EVP_MD_CTX **)&stack0xffffffffffffff90);
    for (local_74 = 0; local_74 < veccount; local_74 = local_74 + 1) {
      EVP_DigestUpdate(pEStack_70,datavec[local_74].iov_base,datavec[local_74].iov_len);
    }
    EVP_DigestFinal(pEStack_70,(uchar *)&ctx,(uint *)0x0);
    EVP_MD_CTX_free(pEStack_70);
    iVar1 = _libssh2_dsa_sha1_sign(dsactx_00,(uchar *)&ctx,0x14,*signature);
    if (iVar1 == 0) {
      session_local._4_4_ = 0;
    }
    else {
      (*session->free)(*signature,&session->abstract);
      session_local._4_4_ = -1;
    }
  }
  return session_local._4_4_;
}

Assistant:

static int
hostkey_method_ssh_dss_signv(LIBSSH2_SESSION * session,
                             unsigned char **signature,
                             size_t *signature_len,
                             int veccount,
                             const struct iovec datavec[],
                             void **abstract)
{
    libssh2_dsa_ctx *dsactx = (libssh2_dsa_ctx *) (*abstract);
    unsigned char hash[SHA_DIGEST_LENGTH];
    libssh2_sha1_ctx ctx;
    int i;

    *signature = LIBSSH2_CALLOC(session, 2 * SHA_DIGEST_LENGTH);
    if (!*signature) {
        return -1;
    }

    *signature_len = 2 * SHA_DIGEST_LENGTH;

    libssh2_sha1_init(&ctx);
    for(i = 0; i < veccount; i++) {
        libssh2_sha1_update(ctx, datavec[i].iov_base, datavec[i].iov_len);
    }
    libssh2_sha1_final(ctx, hash);

    if (_libssh2_dsa_sha1_sign(dsactx, hash, SHA_DIGEST_LENGTH, *signature)) {
        LIBSSH2_FREE(session, *signature);
        return -1;
    }

    return 0;
}